

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::internal::KeyMapBase<unsigned_long>::Resize
          (KeyMapBase<unsigned_long> *this,map_index_t new_num_buckets)

{
  Arena *this_00;
  string *psVar1;
  map_index_t b;
  TableEntryPtr *pTVar2;
  MixingHashState MVar3;
  string *node;
  KeyMapBase<unsigned_long> *this_01;
  uint64_t s;
  unsigned_long local_28 [2];
  KeyMapBase<unsigned_long> *local_18;
  
  this_01 = (KeyMapBase<unsigned_long> *)local_28;
  if ((this->super_UntypedMapBase).num_buckets_ == 1) {
    (this->super_UntypedMapBase).index_of_first_non_null_ = 2;
    (this->super_UntypedMapBase).num_buckets_ = 2;
    this_00 = (this->super_UntypedMapBase).alloc_.arena_;
    if (this_00 == (Arena *)0x0) {
      pTVar2 = (TableEntryPtr *)operator_new(0x10);
    }
    else {
      pTVar2 = (TableEntryPtr *)Arena::AllocateForArray(this_00,0x10);
    }
    *pTVar2 = 0;
    pTVar2[1] = 0;
    (this->super_UntypedMapBase).table_ = pTVar2;
    local_28[0] = rdtsc();
    local_18 = this;
    MVar3 = absl::lts_20240722::hash_internal::
            HashStateBase<absl::lts_20240722::hash_internal::MixingHashState>::
            combine<unsigned_long,google::protobuf::internal::TableEntryPtr*,void_const*>
                      ((MixingHashState)&absl::lts_20240722::hash_internal::MixingHashState::kSeed,
                       local_28,&(this->super_UntypedMapBase).table_,&local_18);
    (this->super_UntypedMapBase).seed_ = (map_index_t)MVar3.state_;
  }
  else {
    if (new_num_buckets < 2) {
      node = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((ulong)new_num_buckets,2,"new_num_buckets >= kMinTableSize");
    }
    else {
      node = (string *)0x0;
    }
    if (node != (string *)0x0) {
      Resize();
      do {
        psVar1 = *(string **)node;
        b = BucketNumber(this_01,*(ViewType *)(node + 8));
        InsertUnique(this_01,b,(KeyNode *)node);
        node = psVar1;
      } while (psVar1 != (string *)0x0);
      return;
    }
    Resize();
  }
  return;
}

Assistant:

void Resize(map_index_t new_num_buckets) {
    if (num_buckets_ == kGlobalEmptyTableSize) {
      // This is the global empty array.
      // Just overwrite with a new one. No need to transfer or free anything.
      num_buckets_ = index_of_first_non_null_ = kMinTableSize;
      table_ = CreateEmptyTable(num_buckets_);
      seed_ = Seed();
      return;
    }

    ABSL_DCHECK_GE(new_num_buckets, kMinTableSize);
    const auto old_table = table_;
    const map_index_t old_table_size = num_buckets_;
    num_buckets_ = new_num_buckets;
    table_ = CreateEmptyTable(num_buckets_);
    const map_index_t start = index_of_first_non_null_;
    index_of_first_non_null_ = num_buckets_;
    for (map_index_t i = start; i < old_table_size; ++i) {
      if (internal::TableEntryIsNonEmptyList(old_table[i])) {
        TransferList(static_cast<KeyNode*>(TableEntryToNode(old_table[i])));
      } else if (internal::TableEntryIsTree(old_table[i])) {
        this->TransferTree(TableEntryToTree(old_table[i]), NodeToVariantKey);
      }
    }
    DeleteTable(old_table, old_table_size);
  }